

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O0

Qiniu_Error
Qiniu_RS_BatchMove(Qiniu_Client *self,Qiniu_RS_BatchItemRet *rets,Qiniu_RS_EntryPathPair *entryPairs
                  ,Qiniu_ItemCount entryCount)

{
  char *body_00;
  Qiniu_RS_BatchItemRet *self_00;
  char *pcVar1;
  size_t bodyLen;
  Qiniu_Int64 QVar2;
  Qiniu_Error QVar3;
  undefined4 uStack_d4;
  char *local_c8;
  char *forceStr;
  char *url;
  char *local_a8;
  char *rsHost;
  Qiniu_RS_EntryPathPair *entryPair;
  Qiniu_ItemCount retSize;
  Qiniu_ItemCount curr;
  char *bodyPart;
  char *entryURIDestEncoded;
  char *entryURIDest;
  char *opBody;
  char *entryURISrcEncoded;
  char *entryURISrc;
  char *bodyTmp;
  char *body;
  cJSON *dataItem;
  cJSON *arrayItem;
  cJSON *root;
  int code;
  Qiniu_ItemCount entryCount_local;
  Qiniu_RS_EntryPathPair *entryPairs_local;
  Qiniu_RS_BatchItemRet *rets_local;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  bodyTmp = (char *)0x0;
  entryURISrc = (char *)0x0;
  entryPair._4_4_ = 0;
  entryPair._0_4_ = 0;
  rsHost = (char *)entryPairs;
  root._4_4_ = entryCount;
  _code = entryPairs;
  entryPairs_local = (Qiniu_RS_EntryPathPair *)rets;
  rets_local = (Qiniu_RS_BatchItemRet *)self;
  QVar3 = _Qiniu_Region_Get_Rs_Host(self,(char *)0x0,(entryPairs->src).bucket,&local_a8);
  err._0_8_ = QVar3.message;
  self_local = (Qiniu_Client *)CONCAT44(url._4_4_,QVar3.code);
  if (QVar3.code == 200) {
    pcVar1 = Qiniu_String_Concat2(local_a8,"/batch");
    entryPair._4_4_ = 0;
    while (self_00 = rets_local, body_00 = bodyTmp, entryPair._4_4_ < root._4_4_) {
      entryURISrcEncoded = Qiniu_String_Concat3(*(char **)rsHost,":",*(char **)(rsHost + 8));
      opBody = Qiniu_String_Encode(entryURISrcEncoded);
      entryURIDestEncoded =
           Qiniu_String_Concat3(*(char **)(rsHost + 0x10),":",*(char **)(rsHost + 0x18));
      bodyPart = Qiniu_String_Encode(entryURIDestEncoded);
      local_c8 = "0";
      if (*(int *)(rsHost + 0x20) == 1) {
        local_c8 = "1";
      }
      _retSize = Qiniu_String_Concat(opBody,"/",bodyPart,"/force/",local_c8,0);
      entryURIDest = Qiniu_String_Concat2("op=/move/",_retSize);
      free(entryURISrcEncoded);
      free(opBody);
      free(entryURIDestEncoded);
      free(bodyPart);
      free(_retSize);
      if (bodyTmp == (char *)0x0) {
        entryURISrc = entryURIDest;
      }
      else {
        entryURISrc = Qiniu_String_Concat3(bodyTmp,"&",entryURIDest);
        free(entryURIDest);
      }
      free(bodyTmp);
      bodyTmp = entryURISrc;
      entryPair._4_4_ = entryPair._4_4_ + 1;
      rsHost = (char *)(_code + entryPair._4_4_);
    }
    bodyLen = strlen(bodyTmp);
    QVar3 = Qiniu_Client_CallWithBuffer
                      ((Qiniu_Client *)self_00,&arrayItem,pcVar1,body_00,bodyLen,
                       "application/x-www-form-urlencoded");
    err._0_8_ = QVar3.message;
    self_local = (Qiniu_Client *)CONCAT44(uStack_d4,QVar3.code);
    free(pcVar1);
    free(bodyTmp);
    entryPair._0_4_ = cJSON_GetArraySize(arrayItem);
    for (entryPair._4_4_ = 0; entryPair._4_4_ < (int)entryPair;
        entryPair._4_4_ = entryPair._4_4_ + 1) {
      dataItem = cJSON_GetArrayItem(arrayItem,entryPair._4_4_);
      QVar2 = Qiniu_Json_GetInt64(dataItem,"code",0);
      root._0_4_ = (int)QVar2;
      body = (char *)cJSON_GetObjectItem(dataItem,"data");
      *(int *)&(&entryPairs_local->src)[entryPair._4_4_].key = (int)root;
      if ((int)root != 200) {
        pcVar1 = Qiniu_Json_GetString((Qiniu_Json *)body,"error",(char *)0x0);
        (&entryPairs_local->src)[entryPair._4_4_].bucket = pcVar1;
      }
    }
  }
  QVar3._0_8_ = (ulong)self_local & 0xffffffff;
  QVar3.message = (char *)err._0_8_;
  return QVar3;
}

Assistant:

Qiniu_Error Qiniu_RS_BatchMove(
    Qiniu_Client *self, Qiniu_RS_BatchItemRet *rets,
    Qiniu_RS_EntryPathPair *entryPairs, Qiniu_ItemCount entryCount)
{
    int code;
    Qiniu_Error err;
    cJSON *root, *arrayItem, *dataItem;
    char *body = NULL, *bodyTmp = NULL;
    char *entryURISrc, *entryURISrcEncoded, *opBody;
    char *entryURIDest, *entryURIDestEncoded, *bodyPart;
    Qiniu_ItemCount curr = 0;
    Qiniu_ItemCount retSize = 0;
    Qiniu_RS_EntryPathPair *entryPair = entryPairs;
    const char *rsHost;

    err = _Qiniu_Region_Get_Rs_Host(self, NULL, entryPair->src.bucket, &rsHost);
    if (err.code != 200)
    {
        return err;
    }

    char *url = Qiniu_String_Concat2(rsHost, "/batch");

    curr = 0;
    while (curr < entryCount)
    {
        entryURISrc = Qiniu_String_Concat3(entryPair->src.bucket, ":", entryPair->src.key);
        entryURISrcEncoded = Qiniu_String_Encode(entryURISrc);
        entryURIDest = Qiniu_String_Concat3(entryPair->dest.bucket, ":", entryPair->dest.key);
        entryURIDestEncoded = Qiniu_String_Encode(entryURIDest);

        char *forceStr = "0";
        if (entryPair->force == Qiniu_True)
        {
            forceStr = "1";
        }

        bodyPart = Qiniu_String_Concat(entryURISrcEncoded, "/", entryURIDestEncoded, "/force/", forceStr, NULL);
        opBody = Qiniu_String_Concat2("op=/move/", bodyPart);
        free(entryURISrc);
        free(entryURISrcEncoded);
        free(entryURIDest);
        free(entryURIDestEncoded);
        free(bodyPart);

        if (!body)
        {
            bodyTmp = opBody;
        }
        else
        {
            bodyTmp = Qiniu_String_Concat3(body, "&", opBody);
            free(opBody);
        }
        free(body);
        body = bodyTmp;
        curr++;
        entryPair = &entryPairs[curr];
    }

    err = Qiniu_Client_CallWithBuffer(self, &root,
                                      url, body, strlen(body), "application/x-www-form-urlencoded");
    free(url);
    free(body);

    retSize = cJSON_GetArraySize(root);

    curr = 0;
    while (curr < retSize)
    {
        arrayItem = cJSON_GetArrayItem(root, curr);
        code = (int)Qiniu_Json_GetInt64(arrayItem, "code", 0);
        dataItem = cJSON_GetObjectItem(arrayItem, "data");

        rets[curr].code = code;

        if (code != 200)
        {
            rets[curr].error = Qiniu_Json_GetString(dataItem, "error", 0);
        }
        curr++;
    }

    return err;
}